

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2scan_x.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double x;
  double in_XMM3_Qa;
  double dVar6;
  double dVar7;
  double dVar8;
  double t135;
  double t131;
  double t130;
  double t126;
  double t125;
  double t123;
  double t121;
  double t120;
  double t117;
  double t115;
  double t113;
  double t112;
  double t110;
  double t107;
  double t106;
  double t101;
  double t99;
  double t97;
  double t95;
  double t93;
  double t91;
  double t90;
  double t89;
  double t88;
  double t86;
  double t85;
  double t84;
  double t83;
  double t82;
  double t81;
  double t80;
  double t79;
  double t78;
  double t75;
  double t71;
  double t68;
  double t67;
  double t66;
  double t65;
  double t61;
  double t58;
  double t57;
  double t55;
  double t54;
  double t52;
  double t49;
  double t45;
  double t38;
  double t37;
  double t35;
  double t34;
  double t33;
  double t30;
  double t20;
  double t19;
  double t18;
  double t16;
  double t14;
  double t12;
  double t11;
  double t9;
  double t8;
  double t3;
  double t119;
  double t118;
  double t53;
  double t51;
  double t50;
  double t41;
  double t40;
  double t39;
  double t29;
  double t28;
  double t27;
  double t24;
  double t22;
  double t7;
  double t32;
  double t26;
  double t25;
  double t23;
  double t5;
  double t4;
  
  piecewise_functor_5<double>(false,-0.999999999999999,false,0.999999999999999,0.0);
  dVar1 = safe_math::cbrt<double>(1.03458037931061e-317);
  dVar2 = safe_math::cbrt<double>(1.03459174282047e-317);
  dVar1 = piecewise_functor_3<double>(false,dVar1 * 1e-15,dVar2);
  dVar2 = safe_math::cbrt<double>(1.03464016125376e-317);
  dVar3 = safe_math::exp<double>(1.0347602192057e-317);
  dVar6 = (1.0 / (dVar2 * dVar2)) / (in_XMM0_Qa * in_XMM0_Qa);
  dVar7 = in_XMM1_Qa * 1.5874010519681996 * dVar6;
  dVar8 = (1.0 - 0.065 / (((dVar3 * -0.12082102608751867 + 0.12345679012345678) * 1.8171205928321397
                           * 0.21733691746289932 * dVar7) / 24.0 + 0.065)) * 0.065;
  x = (in_XMM3_Qa * 1.5874010519681996 * (1.0 / (dVar2 * dVar2 * in_XMM0_Qa)) + dVar7 * -0.125) *
      (1.0 / (in_XMM1_Qa * 0.001 * dVar6 * 1.5874010519681996 * 0.125 + 4.557799872345597));
  piecewise_functor_3<double>
            ((bool)(-((double)(-(ulong)(0.0 < x) & 0x3ff0000000000000) != 0.0) & 1),0.0,x);
  dVar3 = safe_math::exp<double>(1.03517128182304e-317);
  dVar6 = (double)(-(ulong)(2.5 < x) & 0x3ff0000000000000);
  dVar7 = piecewise_functor_3<double>(dVar6 != 0.0,2.5,x);
  dVar4 = dVar7 * dVar7;
  dVar5 = dVar4 * dVar4;
  piecewise_functor_3<double>(dVar6 != 0.0,x,2.5);
  dVar6 = safe_math::exp<double>(1.0353595208341e-317);
  dVar3 = piecewise_functor_5<double>
                    ((double)(-(ulong)(x <= 0.0) & 0x3ff0000000000000) != 0.0,dVar3,
                     (double)(-(ulong)(x <= 2.5) & 0x3ff0000000000000) != 0.0,
                     -(dVar5 * 0.023185843322) * dVar4 * dVar7 +
                     dVar5 * dVar4 * 0.234528941479 +
                     dVar5 * dVar7 * -0.887998041597 +
                     dVar5 * 1.45129704449 +
                     dVar4 * dVar7 * -0.663086601049 + dVar4 * -0.4445555 + dVar7 * -0.667 + 1.0,
                     dVar6 * -1.24);
  safe_math::sqrt<double>(1.03556653433971e-317);
  safe_math::sqrt<double>(1.03557641565263e-317);
  safe_math::sqrt<double>(1.03562335188898e-317);
  dVar6 = safe_math::exp<double>(1.035638667924e-317);
  dVar1 = piecewise_functor_3<double>
                    ((double)(-(ulong)(in_XMM0_Qa * 0.5 <= 1e-11) & 0x3ff0000000000000) != 0.0,0.0,
                     dVar1 * 0.9847450218426964 * -0.375 * dVar2 *
                     (dVar3 * (0.174 - dVar8) + dVar8 + 1.0) * (1.0 - dVar6));
  *in_RDI = dVar1 * 2.0;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps ) {

    (void)(lapl);
    (void)(eps);
    constexpr double t4 = constants::m_cbrt_3;
    constexpr double t5 = constants::m_cbrt_pi;
    constexpr double t23 = constants::m_cbrt_6;
    constexpr double t25 = constants::m_pi_sq;
    constexpr double t26 = constants::m_cbrt_pi_sq;
    constexpr double t32 = constants::m_cbrt_2;
    constexpr double t7 = t4 / t5;
    constexpr double t22 = 0.2e2 / 0.27e2 + 0.5e1 / 0.3e1 * eta;
    constexpr double t24 = t23 * t23;
    constexpr double t27 = t26 * t25;
    constexpr double t28 = 0.1e1 / t27;
    constexpr double t29 = t24 * t28;
    constexpr double t39 = dp2 * dp2;
    constexpr double t40 = t39 * t39;
    constexpr double t41 = 0.1e1 / t40;
    constexpr double t50 = t26 * t26;
    constexpr double t51 = 0.1e1 / t50;
    constexpr double t53 = t32 * t32;
    constexpr double t118 = 0.1e1 / t26;
    constexpr double t119 = t24 * t118;


    const double t3 = rho / 0.2e1 <= dens_tol;
    const double t8 = 0.1e1 <= zeta_tol;
    const double t9 = zeta_tol - 0.1e1;
    const double t11 = piecewise_functor_5( t8, t9, t8, -t9, 0.0 );
    const double t12 = 0.1e1 + t11;
    const double t14 = safe_math::cbrt( zeta_tol );
    const double t16 = safe_math::cbrt( t12 );
    const double t18 = piecewise_functor_3( t12 <= zeta_tol, t14 * zeta_tol, t16 * t12 );
    const double t19 = t7 * t18;
    const double t20 = safe_math::cbrt( rho );
    const double t30 = sigma * sigma;
    const double t33 = rho * rho;
    const double t34 = t33 * t33;
    const double t35 = t34 * rho;
    const double t37 = 0.1e1 / t20 / t35;
    const double t38 = t32 * t37;
    const double t45 = safe_math::exp( -t29 * t30 * t38 * t41 / 0.288e3 );
    const double t49 = ( -0.162742215233874e0 * t22 * t45 + 0.1e2 / 0.81e2 ) * t23;
    const double t52 = t49 * t51;
    const double t54 = sigma * t53;
    const double t55 = t20 * t20;
    const double t57 = 0.1e1 / t55 / t33;
    const double t58 = t54 * t57;
    const double t61 = k1 + t52 * t58 / 0.24e2;
    const double t65 = k1 * ( 0.1e1 - k1 / t61 );
    const double t66 = tau * t53;
    const double t67 = t55 * rho;
    const double t68 = 0.1e1 / t67;
    const double t71 = t66 * t68 - t58 / 0.8e1;
    const double t75 = t53 * t57;
    const double t78 = 0.3e1 / 0.1e2 * t24 * t50 + eta * sigma * t75 / 0.8e1;
    const double t79 = 0.1e1 / t78;
    const double t80 = t71 * t79;
    const double t81 = t80 <= 0.e0;
    const double t82 = 0.e0 < t80;
    const double t83 = piecewise_functor_3( t82, 0.0, t80 );
    const double t84 = c1 * t83;
    const double t85 = 0.1e1 - t83;
    const double t86 = 0.1e1 / t85;
    const double t88 = safe_math::exp( -t84 * t86 );
    const double t89 = t80 <= 0.25e1;
    const double t90 = 0.25e1 < t80;
    const double t91 = piecewise_functor_3( t90, 0.25e1, t80 );
    const double t93 = t91 * t91;
    const double t95 = t93 * t91;
    const double t97 = t93 * t93;
    const double t99 = t97 * t91;
    const double t101 = t97 * t93;
    const double t106 = piecewise_functor_3( t90, t80, 0.25e1 );
    const double t107 = 0.1e1 - t106;
    const double t110 = safe_math::exp( c2 / t107 );
    const double t112 = piecewise_functor_5( t81, t88, t89, 0.1e1 - 0.667e0 * t91 - 0.4445555e0 * t93 - 0.663086601049e0 * t95 + 0.145129704449e1 * t97 - 0.887998041597e0 * t99 + 0.234528941479e0 * t101 - 0.23185843322e-1 * t97 * t95, -d * t110 );
    const double t113 = 0.174e0 - t65;
    const double t115 = t112 * t113 + t65 + 0.1e1;
    const double t117 = safe_math::sqrt( 0.3e1 );
    const double t120 = safe_math::sqrt( sigma );
    const double t121 = t120 * t32;
    const double t123 = 0.1e1 / t20 / rho;
    const double t125 = t119 * t121 * t123;
    const double t126 = safe_math::sqrt( t125 );
    const double t130 = safe_math::exp( -0.98958e1 * t117 / t126 );
    const double t131 = 0.1e1 - t130;
    const double t135 = piecewise_functor_3( t3, 0.0, -0.3e1 / 0.8e1 * t19 * t20 * t115 * t131 );


    eps = 0.2e1 * t135;

  }